

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusStencilVal::emulate_mthd(MthdCelsiusStencilVal *this)

{
  uint local_14;
  uint32_t err;
  MthdCelsiusStencilVal *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = 4;
  }
  if ((this->which == 0) && (((this->super_SingleMthdTest).super_MthdTest.val & 0xffffff00) != 0)) {
    local_14 = local_14 | 2;
  }
  if (local_14 == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a &
           ((uint)(0xffL << ((char)(this->which << 3) + 8U & 0x3f)) ^ 0xffffffff) |
           (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val & 0xff) <<
                 ((char)(this->which << 3) + 8U & 0x3f));
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1d,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_stencil_a,true);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (which == 0 && val & ~0xff)
			err |= 2;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_stencil_a, 8 + 8 * which, 8, val);
				pgraph_celsius_icmd(&exp, 0x1d, exp.bundle_stencil_a, true);
			}
		}
	}